

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.c
# Opt level: O1

void set_EFF(void)

{
  uint uVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  Yshort **ppYVar4;
  uint *R;
  int iVar5;
  int iVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  
  iVar6 = nvars + 0x3e;
  if (-1 < nvars + 0x1f) {
    iVar6 = nvars + 0x1f;
  }
  R = (uint *)allocate(nvars * (iVar6 >> 5) * 4);
  ppYVar4 = derives;
  pYVar3 = rrhs;
  pYVar2 = ritem;
  lVar7 = (long)start_symbol;
  EFF = R;
  if (start_symbol < nsyms) {
    puVar8 = R;
    do {
      puVar9 = (uint *)ppYVar4[lVar7];
      uVar1 = *puVar9;
      while (0 < (int)uVar1) {
        puVar9 = puVar9 + 1;
        iVar5 = pYVar2[pYVar3[uVar1]] - start_symbol;
        if (start_symbol <= pYVar2[pYVar3[uVar1]]) {
          puVar8[iVar5 >> 5] = puVar8[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
        }
        uVar1 = *puVar9;
      }
      puVar8 = puVar8 + (iVar6 >> 5);
      lVar7 = lVar7 + 1;
    } while (lVar7 < nsyms);
  }
  reflexive_transitive_closure(R,nvars);
  return;
}

Assistant:

void set_EFF()
{
    register unsigned *row;
    register int symbol;
    register Yshort *sp;
    register int rowsize;
    register int i;
    register int rule;

    rowsize = WORDSIZE(nvars);
    EFF = NEW2(nvars * rowsize, unsigned);

    row = EFF;
    for (i = start_symbol; i < nsyms; i++)
    {
	sp = derives[i];
	for (rule = *sp; rule > 0; rule = *++sp)
	{
	    symbol = ritem[rrhs[rule]];
	    if (ISVAR(symbol))
	    {
		symbol -= start_symbol;
		SETBIT(row, symbol);
	    }
	}
	row += rowsize;
    }

    reflexive_transitive_closure(EFF, nvars);

#ifdef	DEBUG
    print_EFF();
#endif
}